

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

void Sbd_ManDeriveMapping_rec(Sbd_Man_t *p,Gia_Man_t *pNew,int iObj)

{
  Vec_Int_t *p_00;
  int iVar1;
  Gia_Obj_t *pObj_00;
  int *piVar2;
  int *pCut;
  int k;
  Gia_Obj_t *pObj;
  int iObj_local;
  Gia_Man_t *pNew_local;
  Sbd_Man_t *p_local;
  
  if ((iObj != 0) && (iVar1 = Gia_ObjIsTravIdCurrentId(pNew,iObj), iVar1 == 0)) {
    Gia_ObjSetTravIdCurrentId(pNew,iObj);
    pObj_00 = Gia_ManObj(pNew,iObj);
    iVar1 = Gia_ObjIsCi(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj_00);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                      ,0x7a2,"void Sbd_ManDeriveMapping_rec(Sbd_Man_t *, Gia_Man_t *, int)");
      }
      piVar2 = Sbd_ObjCut2(p,iObj);
      for (pCut._4_4_ = 1; pCut._4_4_ <= *piVar2; pCut._4_4_ = pCut._4_4_ + 1) {
        Sbd_ManDeriveMapping_rec(p,pNew,piVar2[pCut._4_4_]);
      }
      p_00 = pNew->vMapping;
      iVar1 = Vec_IntSize(pNew->vMapping);
      Vec_IntWriteEntry(p_00,iObj,iVar1);
      for (pCut._4_4_ = 0; pCut._4_4_ <= *piVar2; pCut._4_4_ = pCut._4_4_ + 1) {
        Vec_IntPush(pNew->vMapping,piVar2[pCut._4_4_]);
      }
      Vec_IntPush(pNew->vMapping,iObj);
    }
  }
  return;
}

Assistant:

void Sbd_ManDeriveMapping_rec( Sbd_Man_t * p, Gia_Man_t * pNew, int iObj )
{
    Gia_Obj_t * pObj; int k, * pCut;
    if ( !iObj || Gia_ObjIsTravIdCurrentId(pNew, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(pNew, iObj);
    pObj = Gia_ManObj( pNew, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    pCut = Sbd_ObjCut2( p, iObj );
    for ( k = 1; k <= pCut[0]; k++ )
        Sbd_ManDeriveMapping_rec( p, pNew, pCut[k] );
    // add mapping
    Vec_IntWriteEntry( pNew->vMapping, iObj, Vec_IntSize(pNew->vMapping) );
    for ( k = 0; k <= pCut[0]; k++ )
        Vec_IntPush( pNew->vMapping, pCut[k] );
    Vec_IntPush( pNew->vMapping, iObj );
}